

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish.cpp
# Opt level: O3

int __thiscall ncnn::Mish::forward_inplace(Mish *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  void *pvVar7;
  float fVar8;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar7 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    lVar5 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar4 = 0;
        do {
          __x = *(float *)((long)pvVar7 + uVar4 * 4);
          fVar8 = __x;
          if (__x <= 20.0) {
            fVar8 = expf(__x);
            if (-20.0 <= __x) {
              fVar8 = logf(fVar8 + 1.0);
            }
          }
          fVar8 = tanhf(fVar8);
          *(float *)((long)pvVar7 + uVar4 * 4) = fVar8 * __x;
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
      }
      lVar5 = lVar5 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    } while (lVar5 != iVar1);
  }
  return 0;
}

Assistant:

int Mish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            const float MISH_THRESHOLD = 20;
            float x = ptr[i], y;
            if (x > MISH_THRESHOLD)
                y = x;
            else if (x < -MISH_THRESHOLD)
                y = expf(x);
            else
                y = logf(expf(x) + 1);
            ptr[i] = x * tanhf(y);
        }
    }

    return 0;
}